

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

void __thiscall
CLI::ValidationError::ValidationError(ValidationError *this,string *name,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ::std::operator+(&local_38,name,": ");
  ::std::operator+(&bStack_58,&local_38,msg);
  ValidationError(this,&bStack_58);
  ::std::__cxx11::string::~string((string *)&bStack_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

explicit ValidationError(std::string name, std::string msg) : ValidationError(name + ": " + msg) {}